

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_type.hpp
# Opt level: O0

void __thiscall duckdb::string_t::Finalize(string_t *this)

{
  idx_t iVar1;
  char *pcVar2;
  string_t *in_RDI;
  char *dataptr;
  string_t *in_stack_ffffffffffffffe0;
  void *__s;
  
  iVar1 = GetSize(in_RDI);
  if (iVar1 < 0xd) {
    iVar1 = GetSize(in_RDI);
    __s = (void *)((long)&in_RDI->value + iVar1 + 4);
    iVar1 = GetSize(in_RDI);
    memset(__s,0,0xc - iVar1);
  }
  else {
    pcVar2 = GetData(in_stack_ffffffffffffffe0);
    *(undefined4 *)((long)&in_RDI->value + 4) = *(undefined4 *)pcVar2;
  }
  return;
}

Assistant:

void Finalize() {
		// set trailing NULL byte
		if (GetSize() <= INLINE_LENGTH) {
			// fill prefix with zeros if the length is smaller than the prefix length
			memset(value.inlined.inlined + GetSize(), 0, INLINE_BYTES - GetSize());
		} else {
			// copy the data into the prefix
#ifndef DUCKDB_DEBUG_NO_INLINE
			auto dataptr = GetData();
			memcpy(value.pointer.prefix, dataptr, PREFIX_LENGTH);
#else
			memset(value.pointer.prefix, 0, PREFIX_BYTES);
#endif
		}
	}